

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

QString * __thiscall QCss::Symbol::lexem(QString *__return_storage_ptr__,Symbol *this)

{
  char16_t cVar1;
  int iVar2;
  int iVar3;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  if (0 < (long)this->len) {
    QString::reserve(__return_storage_ptr__,(long)this->len);
  }
  for (iVar3 = 0; iVar2 = this->len, iVar3 < iVar2;
      iVar3 = iVar3 + (uint)(iVar3 < iVar2 + -1 && cVar1 == L'\\') + 1) {
    cVar1 = (this->text).d.ptr[this->start + iVar3];
    QString::append((QChar)(char16_t)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QString Symbol::lexem() const
{
    QString result;
    if (len > 0)
        result.reserve(len);
    for (int i = 0; i < len; ++i) {
        if (text.at(start + i) == u'\\' && i < len - 1)
            ++i;
        result += text.at(start + i);
    }
    return result;
}